

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O0

bool __thiscall
Js::FunctionCodeGenJitTimeData::IsPolymorphicCallSite
          (FunctionCodeGenJitTimeData *this,ProfileId profiledCallSiteId)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  FunctionBody *pFVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> **ppWVar6;
  FunctionCodeGenJitTimeData *pFVar7;
  FunctionCodeGenJitTimeData **ppFVar8;
  bool local_25;
  ProfileId profiledCallSiteId_local;
  FunctionCodeGenJitTimeData *this_local;
  
  pFVar4 = GetFunctionBody(this);
  if (pFVar4 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x4b,"(GetFunctionBody())","GetFunctionBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar4 = GetFunctionBody(this);
  PVar3 = FunctionBody::GetProfiledCallSiteCount(pFVar4);
  if (PVar3 <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x4c,
                                "(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount())"
                                ,
                                "profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->inlinees);
  if (*ppWVar6 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    local_25 = false;
  }
  else {
    ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->inlinees);
    pFVar7 = Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::operator->
                       (*ppWVar6 + profiledCallSiteId);
    ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenJitTimeData__
                        ((WriteBarrierPtr *)&pFVar7->next);
    local_25 = *ppFVar8 != (FunctionCodeGenJitTimeData *)0x0;
  }
  return local_25;
}

Assistant:

bool FunctionCodeGenJitTimeData::IsPolymorphicCallSite(const ProfileId profiledCallSiteId) const
    {
        Assert(GetFunctionBody());
        Assert(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount());

        return inlinees ? inlinees[profiledCallSiteId]->next != nullptr : false;
    }